

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

int cppcms_capi_session_set_session_cookie(cppcms_capi_session *session,char *session_cookie_value)

{
  char *in_RSI;
  cppcms_capi_session *in_RDI;
  int local_4;
  
  if (in_RDI == (cppcms_capi_session *)0x0) {
    local_4 = -1;
  }
  else {
    anon_unknown.dwarf_2860d0::check_str((char *)in_RDI);
    cppcms_capi_session::check(in_RDI);
    std::__cxx11::string::operator=((string *)&(in_RDI->adapter).value,in_RSI);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int cppcms_capi_session_set_session_cookie(cppcms_capi_session *session,char const *session_cookie_value)
{
	TRY {
		if(!session)
			return -1;
		check_str(session_cookie_value);
		session->check();
		session->adapter.value = session_cookie_value;
	}